

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

Result __thiscall
Inferences::SimplifyingGeneratingLiteralSimplification::simplify
          (SimplifyingGeneratingLiteralSimplification *this,Clause *cl_,bool doOrderingCheck)

{
  Literal *elem;
  Literal *elem_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  undefined1 extraout_DL;
  ulong uVar4;
  uint i;
  ulong uVar5;
  Result RVar6;
  Stack<Kernel::Literal_*> out;
  undefined4 local_a0;
  SimplifyingInference1 local_90;
  Stack<Kernel::Literal_*> local_80;
  Inference local_60;
  
  Lib::Stack<Kernel::Literal_*>::Stack
            (&local_80,(ulong)((uint)*(undefined8 *)&cl_->field_0x38 & 0xfffff));
  local_a0 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  uVar5 = 0;
  bVar1 = 0;
  uVar4 = 0;
  do {
    if (((uint)*(undefined8 *)&cl_->field_0x38 & 0xfffff) <= uVar5) {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        local_90.rule = this->_rule;
        local_90.premise._0_1_ = SUB81(cl_,0);
        local_90.premise._1_7_ = (undefined7)((ulong)cl_ >> 8);
        Kernel::Inference::Inference(&local_60,&local_90);
        cl_ = Kernel::Clause::fromStack(&local_80,&local_60);
        uVar4 = (ulong)CONCAT31((int3)((uint)local_a0 >> 8),(byte)local_a0 & bVar1);
      }
LAB_004037ab:
      Lib::Stack<Kernel::Literal_*>::~Stack(&local_80);
      RVar6._8_8_ = uVar4;
      RVar6.simplified = cl_;
      return RVar6;
    }
    elem = cl_->_literals[uVar5];
    uVar2 = (*(this->super_SimplifyingGeneratingInference1).super_SimplifyingGeneratingInference.
              super_InferenceEngine._vptr_InferenceEngine[8])(this,elem);
    local_90.rule = (InferenceRule)uVar2;
    local_90._1_7_ = SUB87(CONCAT44(extraout_var,uVar2) >> 8,0);
    elem_00 = (Literal *)CONCAT17(extraout_DL,local_90._1_7_);
    local_90.premise._0_1_ = extraout_DL;
    if (elem_00 == elem && (uVar2 & 1) == 0) {
      Lib::Stack<Kernel::Literal_*>::push(&local_80,elem);
    }
    else {
      *(int *)(DAT_00a141a0 + 400) = *(int *)(DAT_00a141a0 + 400) + 1;
      if ((uVar2 & 1) == 0) {
        Lib::Stack<Kernel::Literal_*>::push(&local_80,elem_00);
        if (doOrderingCheck) {
          iVar3 = (*this->_ordering->_vptr_Ordering[2])(this->_ordering,elem_00,elem);
          if (iVar3 == 1) {
            *(int *)(DAT_00a141a0 + 0x18c) = *(int *)(DAT_00a141a0 + 0x18c) + 1;
LAB_00403750:
            local_a0 = 0;
          }
          else if (iVar3 == 2) {
            bVar1 = 1;
          }
          else if (iVar3 == 4) {
            *(int *)(DAT_00a141a0 + 0x188) = *(int *)(DAT_00a141a0 + 0x188) + 1;
            goto LAB_00403750;
          }
        }
        uVar4 = 1;
      }
      else {
        uVar4 = 1;
        if ((uVar2 & 0x100) != 0) {
          cl_ = (Clause *)0x0;
          goto LAB_004037ab;
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

SimplifyingGeneratingInference1::Result SimplifyingGeneratingLiteralSimplification::simplify(Clause* cl_, bool doOrderingCheck) {
  DEBUG("in:  ", *cl_)
  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;
  bool allLessEq = true;
  bool oneLess = false;

  for (unsigned i = 0; i < cl.size(); i++) {

    auto orig = cl[i];
    auto result = simplifyLiteral(orig);

    if (result.isLiteral() && result.unwrapLiteral() == orig ) {
      out.push(orig);
    } else {
      auto simpl = result;
      env.statistics->evaluationCnt++;

      if (simpl.isConstant()) {

        bool trivialValue = simpl.unwrapConstant();
        if (trivialValue) {
          /* clause is a tautology and can be deleted */
          return SimplifyingGeneratingInference1::Result::tautology();
        } else {
          /* do not add the literal to the output stack */
          changed = true;
        }

      } else {

        Literal* simplLit = simpl.unwrapLiteral();
        ASS_NEQ(simplLit, orig)
        changed = true;
        out.push(simplLit);

        if (doOrderingCheck) {
          ASS(_ordering)
          auto cmp = _ordering->compare(simplLit, orig);
          switch(cmp) {
            case Ordering::Result::LESS:
              oneLess = true;
              break;
            case Ordering::Result::EQUAL:
              ASSERTION_VIOLATION
              break;
            case Ordering::Result::INCOMPARABLE:
            case Ordering::Result::GREATER:
              if (cmp == Ordering::Result::INCOMPARABLE) {
                env.statistics->evaluationIncomp++;
              } else {
                env.statistics->evaluationGreater++;
              }
              DEBUG("ordering violated: ", cmp)
              DEBUG("orig: ", *orig)
              DEBUG("simp: ", *simplLit)
              allLessEq = false;
              break;
          }
        }
      }
    }
  }


  if (!changed) {
    return SimplifyingGeneratingInference1::Result::nop(cl_);
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(_rule, cl_));
    DEBUG("out: ", *result)
    return SimplifyingGeneratingInference1::Result{
            .simplified = result, 
            .premiseRedundant = allLessEq && oneLess,
          };
  }
}